

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void __thiscall HACD::MyHeapManager::heap_malloc(MyHeapManager *this)

{
  size_t in_RSI;
  
  heap_malloc((MyHeapManager *)&this[-1].mMicro,in_RSI);
  return;
}

Assistant:

virtual void * heap_malloc(size_t size)
  {
    void *ret;

    if ( size <= 256 ) // micro allocator only handles allocations between 0 and 256 bytes in length.
    {
        ret = mMicro->malloc(size);
    }
    else
    {
        ret = ::malloc(size);
    }
    return ret;
  }